

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  undefined4 uVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  string *psVar4;
  undefined1 local_68 [8];
  string module_name_1;
  int i_1;
  undefined1 local_38 [8];
  string module_name;
  int i;
  Generator *this_local;
  
  module_name.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = module_name.field_2._12_4_;
    iVar2 = FileDescriptor::dependency_count(this->file_);
    if (iVar2 <= (int)uVar1) break;
    pFVar3 = FileDescriptor::dependency(this->file_,module_name.field_2._12_4_);
    psVar4 = FileDescriptor::name_abi_cxx11_(pFVar3);
    anon_unknown_0::ModuleName((string *)local_38,psVar4);
    io::Printer::Print(this->printer_,"import $module$\n","module",(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    module_name.field_2._12_4_ = module_name.field_2._12_4_ + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  module_name_1.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = module_name_1.field_2._8_4_;
    iVar2 = FileDescriptor::public_dependency_count(this->file_);
    if (iVar2 <= (int)uVar1) break;
    pFVar3 = FileDescriptor::public_dependency(this->file_,module_name_1.field_2._8_4_);
    psVar4 = FileDescriptor::name_abi_cxx11_(pFVar3);
    anon_unknown_0::ModuleName((string *)local_68,psVar4);
    io::Printer::Print(this->printer_,"from $module$ import *\n","module",(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    module_name_1.field_2._8_4_ = module_name_1.field_2._8_4_ + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    string module_name = ModuleName(file_->dependency(i)->name());
    printer_->Print("import $module$\n", "module",
                    module_name);
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}